

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O0

curlioerr ioctl_callback(CURL *handle,int cmd,void *clientp)

{
  void *clientp_local;
  int cmd_local;
  CURL *handle_local;
  
  if (cmd == 1) {
    curl_mprintf("APPLICATION: received a CURLIOCMD_RESTARTREAD request\n");
    curl_mprintf("APPLICATION: ** REWINDING! **\n");
    current_offset = 0;
  }
  handle_local._4_4_ = (curlioerr)(cmd != 1);
  return handle_local._4_4_;
}

Assistant:

static curlioerr ioctl_callback(CURL *handle, int cmd, void *clientp)
{
  (void)clientp;
  if(cmd == CURLIOCMD_RESTARTREAD) {
    printf("APPLICATION: received a CURLIOCMD_RESTARTREAD request\n");
    printf("APPLICATION: ** REWINDING! **\n");
    current_offset = 0;
    return CURLIOE_OK;
  }
  (void)handle;
  return CURLIOE_UNKNOWNCMD;
}